

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void allocate_imp_map<ImputedData<long,long_double>,InputData<float,long>>
               (robin_map<unsigned_long,_ImputedData<long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                *impute_map,InputData<float,_long> *input_data)

{
  robin_iterator<false> rVar1;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_ImputedData<long,_long_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar2;
  tuple<> local_151;
  unsigned_long local_150;
  unsigned_long *local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  robin_hash<std::pair<unsigned_long,ImputedData<long,long_double>>,tsl::robin_map<unsigned_long,ImputedData<long,long_double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,ImputedData<long,long_double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  *local_128;
  ImputedData<long,_long_double> local_120;
  
  local_150 = 0;
  if (input_data->nrows != 0) {
    local_128 = (robin_hash<std::pair<unsigned_long,ImputedData<long,long_double>>,tsl::robin_map<unsigned_long,ImputedData<long,long_double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,ImputedData<long,long_double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 *)impute_map;
    do {
      if ((input_data->has_missing).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[local_150] != '\0') {
        ImputedData<long,long_double>::ImputedData<InputData<float,long>>
                  ((ImputedData<long,long_double> *)&local_120,input_data,local_150);
        local_148 = &local_150;
        pVar2 = tsl::detail_robin_hash::
                robin_hash<std::pair<unsigned_long,ImputedData<long,long_double>>,tsl::robin_map<unsigned_long,ImputedData<long,long_double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,ImputedData<long,long_double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,long_double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                ::
                insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                          (local_128,&local_150,(piecewise_construct_t *)&std::piecewise_construct,
                           (tuple<const_unsigned_long_&> *)&local_148,&local_151);
        rVar1 = pVar2.first.m_bucket;
        std::vector<long_double,_std::allocator<long_double>_>::_M_move_assign
                  ((vector<long_double,_std::allocator<long_double>_> *)
                   ((rVar1.m_bucket)->m_value + 8),&local_120,pVar2._8_8_);
        std::vector<long_double,_std::allocator<long_double>_>::_M_move_assign
                  ((vector<long_double,_std::allocator<long_double>_> *)
                   ((rVar1.m_bucket)->m_value + 0x20),&local_120.num_weight);
        local_148 = *(unsigned_long **)((rVar1.m_bucket)->m_value + 0x38);
        uStack_140 = *(undefined8 *)((rVar1.m_bucket)->m_value + 0x40);
        local_138 = *(undefined8 *)((rVar1.m_bucket)->m_value + 0x48);
        *(pointer *)((rVar1.m_bucket)->m_value + 0x38) =
             local_120.cat_sum.
             super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)((rVar1.m_bucket)->m_value + 0x40) =
             local_120.cat_sum.
             super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)((rVar1.m_bucket)->m_value + 0x48) =
             local_120.cat_sum.
             super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_120.cat_sum.
        super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_120.cat_sum.
        super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_120.cat_sum.
        super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
        ::~vector((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                   *)&local_148);
        std::vector<long_double,_std::allocator<long_double>_>::_M_move_assign
                  ((vector<long_double,_std::allocator<long_double>_> *)
                   ((rVar1.m_bucket)->m_value + 0x50),&local_120.cat_weight);
        std::vector<long_double,_std::allocator<long_double>_>::_M_move_assign
                  ((vector<long_double,_std::allocator<long_double>_> *)
                   ((rVar1.m_bucket)->m_value + 0x68),&local_120.sp_num_sum);
        std::vector<long_double,_std::allocator<long_double>_>::_M_move_assign
                  ((vector<long_double,_std::allocator<long_double>_> *)
                   ((rVar1.m_bucket)->m_value + 0x80),&local_120.sp_num_weight);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((rVar1.m_bucket)->m_value + 0x98),&local_120.missing_num);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((rVar1.m_bucket)->m_value + 0xb0),&local_120.missing_cat);
        std::vector<long,_std::allocator<long>_>::_M_move_assign
                  ((vector<long,_std::allocator<long>_> *)((rVar1.m_bucket)->m_value + 200),
                   &local_120.missing_sp);
        *(size_t *)((rVar1.m_bucket)->m_value + 0xf0) = local_120.n_missing_sp;
        *(size_t *)((rVar1.m_bucket)->m_value + 0xe0) = local_120.n_missing_num;
        *(size_t *)((rVar1.m_bucket)->m_value + 0xe8) = local_120.n_missing_cat;
        ImputedData<long,_long_double>::~ImputedData(&local_120);
      }
      local_150 = local_150 + 1;
    } while (local_150 < input_data->nrows);
  }
  return;
}

Assistant:

void allocate_imp_map(hashed_map<size_t, ImputedData> &impute_map, InputData &input_data)
{
    for (size_t row = 0; row < input_data.nrows; row++)
        if (input_data.has_missing[row])
            impute_map[row] = ImputedData(input_data, row);
}